

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssa.cpp
# Opt level: O2

void __thiscall mocker::SSADestruction::insertAllocas(SSADestruction *this)

{
  FunctionModule *hint;
  SSADestruction *pSVar1;
  pointer pbVar2;
  __shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2> *this_00;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  pointer __k;
  shared_ptr<mocker::ir::Phi> phi;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  varNames;
  shared_ptr<mocker::ir::Reg> addr;
  allocator<char> local_99;
  _List_node_base *local_98;
  SSADestruction *local_90;
  element_type *local_88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_80 [3];
  shared_ptr<mocker::ir::IRInst> local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (key_type *)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (key_type *)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var4 = (_List_node_base *)&((this->super_FuncPass).func)->bbs;
  local_98 = p_Var4;
  local_90 = this;
  do {
    pbVar2 = local_58.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pSVar1 = local_90;
    p_Var4 = (((_List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_> *)
              &p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var4 == local_98) {
      local_98 = (_List_node_base *)&local_90->addresses;
      for (__k = local_58.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; __k != pbVar2; __k = __k + 1) {
        hint = (pSVar1->super_FuncPass).func;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"",&local_99);
        ir::FunctionModule::makeTempLocalReg
                  ((FunctionModule *)&stack0xffffffffffffffc0,&hint->identifier);
        std::__cxx11::string::~string((string *)&local_88);
        this_00 = &std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)local_98,__k)->
                   super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>;
        std::__shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (this_00,(__shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2> *)
                           &stack0xffffffffffffffc0);
        p_Var4 = (((pSVar1->super_FuncPass).func)->bbs).
                 super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>.
                 _M_impl._M_node.super__List_node_base._M_next;
        std::make_shared<mocker::ir::Alloca,std::shared_ptr<mocker::ir::Reg>&>
                  ((shared_ptr<mocker::ir::Reg> *)&local_88);
        local_68.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             local_88;
        local_68.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = a_Stack_80[0]._M_pi;
        local_88 = (element_type *)0x0;
        a_Stack_80[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        ir::BasicBlock::appendInstFront((BasicBlock *)(p_Var4 + 1),&local_68);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_68.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_80);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc8);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_58);
      return;
    }
    p_Var3 = (_List_node_base *)&p_Var4[1]._M_prev;
    while (p_Var3 = p_Var3->_M_next, p_Var3 != (_List_node_base *)&p_Var4[1]._M_prev) {
      ir::dyc<mocker::ir::Phi,std::shared_ptr<mocker::ir::IRInst>const&>
                ((ir *)&local_88,(shared_ptr<mocker::ir::IRInst> *)(p_Var3 + 1));
      if (local_88 == (element_type *)0x0) {
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_80);
        break;
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string_const&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (*(long *)&local_88[1].type + 8));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_80);
    }
  } while( true );
}

Assistant:

void SSADestruction::insertAllocas() {
  std::vector<std::string> varNames;

  for (auto &bb : func.getBBs()) {
    for (auto &inst : bb.getInsts()) {
      auto phi = ir::dyc<ir::Phi>(inst);
      if (!phi)
        break;
      varNames.emplace_back(phi->getDest()->getIdentifier());
    }
  }

  for (auto &varName : varNames) {
    auto addr = func.makeTempLocalReg();
    addresses[varName] = addr;
    func.getFirstBB()->appendInstFront(std::make_shared<ir::Alloca>(addr));
  }
}